

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digit_comparison.h
# Opt level: O1

adjusted_mantissa fast_float::positive_digit_comp<float>(bigint *bigmant,int32_t exponent)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  uint64_t uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  adjusted_mantissa aVar12;
  bool truncated;
  bool local_19;
  
  bVar2 = bigint::pow5(bigmant,exponent);
  if (bVar2) {
    bigint::shl(bigmant,(ulong)(uint)exponent);
  }
  uVar4 = bigint::hi64(bigmant,&local_19);
  iVar3 = bigint::ctlz(bigmant);
  iVar3 = (uint)(bigmant->vec).length * 0x40 - iVar3;
  if (iVar3 < -0x7d) {
    iVar9 = 0;
    if (-0x55 - iVar3 < 0x40) {
      iVar9 = -0x55 - iVar3;
    }
    bVar8 = (byte)iVar9;
    uVar7 = 0;
    if (-0x95 < iVar3) {
      uVar7 = uVar4 >> (bVar8 & 0x3f);
    }
    uVar5 = ~(-1L << (bVar8 & 0x3f));
    if (iVar3 < -0x94) {
      uVar5 = 0xffffffffffffffff;
    }
    uVar5 = uVar5 & uVar4;
    uVar6 = 1;
    uVar11 = 1L << (bVar8 - 1 & 0x3f);
    if ((uVar5 <= uVar11) && ((uVar5 != uVar11 || (local_19 == false)))) {
      uVar6 = (ulong)(uVar5 == uVar11 & (byte)uVar7);
    }
    uVar5 = (ulong)(0x7fffff < uVar6 + uVar7);
    uVar7 = uVar6 + uVar7;
  }
  else {
    uVar5 = 1;
    if (((uVar4 & 0xffffffffff) < 0x8000000001) &&
       (((uVar4 & 0xffffffffff) != 0x8000000000 || (local_19 == false)))) {
      uVar5 = (ulong)((uVar4 & 0x1ffffffffff) == 0x18000000000);
    }
    uVar5 = uVar5 + (uVar4 >> 0x28);
    uVar10 = (uVar5 < 0x1000000 ^ 0x7f) + iVar3;
    uVar7 = (ulong)((uint)uVar5 & 0x17fffff);
    if (uVar5 >= 0x1000000) {
      uVar7 = 0;
    }
    uVar1 = uVar10;
    if (0xfe < (int)uVar10) {
      uVar1 = 0xff;
    }
    uVar5 = (ulong)uVar1;
    if (0xfe < (int)uVar10) {
      uVar7 = 0;
    }
  }
  aVar12._8_8_ = uVar5;
  aVar12.mantissa = uVar7;
  return aVar12;
}

Assistant:

inline FASTFLOAT_CONSTEXPR20
adjusted_mantissa positive_digit_comp(bigint& bigmant, int32_t exponent) noexcept {
  FASTFLOAT_ASSERT(bigmant.pow10(uint32_t(exponent)));
  adjusted_mantissa answer;
  bool truncated;
  answer.mantissa = bigmant.hi64(truncated);
  int bias = binary_format<T>::mantissa_explicit_bits() - binary_format<T>::minimum_exponent();
  answer.power2 = bigmant.bit_length() - 64 + bias;

  round<T>(answer, [truncated](adjusted_mantissa& a, int32_t shift) {
    round_nearest_tie_even(a, shift, [truncated](bool is_odd, bool is_halfway, bool is_above) -> bool {
      return is_above || (is_halfway && truncated) || (is_odd && is_halfway);
    });
  });

  return answer;
}